

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O1

int __thiscall Am_GIF_Image::process_gif(Am_GIF_Image *this,ifstream *ifs,GIF_Load_Info *gli)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  uchar buf [256];
  unsigned_short stack [4096];
  unsigned_short suffix [4096];
  unsigned_short prefix [4096];
  ulong local_61b8;
  uint local_61b0;
  uint local_61ac;
  int local_61a8;
  ushort local_61a4;
  byte local_6198;
  ulong local_6188;
  byte local_6138 [254];
  unsigned_short uStack_603a;
  ushort auStack_6038 [4096];
  ushort auStack_4038 [4096];
  ushort auStack_2038 [4100];
  
  iVar19 = (this->super_Am_Generic_Image).iminfo.num_colors;
  gli->x = 0;
  gli->y = 0;
  uVar3 = std::istream::get();
  iVar18 = 0;
  if (0xfffffff8 < uVar3 - 9) {
    uVar20 = 1 << ((byte)uVar3 & 0x1f);
    uVar3 = uVar3 + 1;
    iVar11 = 1 << ((byte)uVar3 & 0x1f);
    iVar18 = 1;
    std::ios::clear((int)*(undefined8 *)(*(long *)ifs + -0x18) + (int)ifs);
    uVar4 = std::istream::get();
    uVar4 = uVar4 & 0xffff;
    if (uVar4 != 0) {
      uVar1 = iVar19 - 1;
      uVar12 = uVar20 + 1;
      local_61b8 = 0;
      local_6188 = 0;
      uVar15 = 0;
      local_61b0 = iVar11 - 1U;
      local_61ac = uVar12;
      uVar13 = uVar20 + 2;
      uVar17 = uVar12;
      iVar19 = iVar11;
      uVar8 = uVar3;
      do {
        std::istream::read((char *)ifs,(long)local_6138);
        if (((byte)ifs[*(long *)(*(long *)ifs + -0x18) + 0x20] & 5) != 0) {
          return 0;
        }
        bVar24 = true;
        uVar6 = 0;
        do {
          local_6188 = local_6188 | (ulong)local_6138[uVar6] << ((byte)uVar15 & 0x3f);
          uVar15 = uVar15 + 8;
          do {
            uVar14 = uVar15;
            uVar7 = uVar8;
            uVar8 = uVar7;
            uVar15 = uVar14;
            if (uVar14 < uVar7) break;
            uVar10 = local_61b0 & (uint)local_6188;
            local_6188 = local_6188 >> ((byte)uVar7 & 0x3f);
            if ((ushort)uVar10 == (ushort)uVar12) {
              local_61a8 = 1;
              bVar2 = false;
            }
            else {
              if (uVar20 == (uVar10 & 0xffff)) {
                uVar10 = 0xffff;
                local_61b8 = 0;
                local_61b0 = iVar11 - 1U;
                uVar13 = uVar20 + 2;
                iVar19 = iVar11;
                uVar8 = uVar3;
              }
              else {
                if ((short)local_61ac != -1) {
                  uVar16 = uVar10;
                  if ((ushort)uVar13 <= (ushort)uVar10) {
                    local_6198 = (byte)uVar17;
                    auStack_6038[local_61b8 & 0xffff] = (ushort)local_6198;
                    local_61b8 = (ulong)((int)local_61b8 + 1);
                    uVar16 = local_61ac;
                  }
                  local_61a4 = (ushort)uVar1;
                  bVar2 = (ushort)uVar16 <= local_61a4;
                  if (local_61a4 < (ushort)uVar16) {
                    if ((uVar16 & 0xffff) < 0x1000) {
                      uVar5 = local_61b8 & 0xffff;
                      if ((ushort)local_61b8 < 0xffe) {
                        do {
                          uVar9 = (ulong)((uVar16 & 0xffff) * 2);
                          auStack_6038[uVar5] = *(ushort *)((long)auStack_4038 + uVar9);
                          uVar15 = *(ushort *)((long)auStack_2038 + uVar9);
                          uVar16 = (uint)uVar15;
                          bVar2 = uVar15 <= local_61a4;
                          if (uVar15 <= local_61a4) {
                            local_61b8 = (ulong)((int)uVar5 + 1);
                            goto LAB_0019fb8d;
                          }
                          local_61b8 = uVar5 + 1;
                        } while ((uVar16 < 0x1000) &&
                                (bVar23 = uVar5 < 0xffd, uVar5 = local_61b8, bVar23));
                      }
                    }
                    local_61a8 = 0;
                  }
                  else {
LAB_0019fb8d:
                    uVar17 = uVar16 & uVar1;
                    auStack_6038[local_61b8 & 0xffff] = (ushort)uVar17 & 0xff;
                    if (-1 < (short)(ushort)local_61b8) {
                      lVar21 = (local_61b8 & 0xffff) + 1;
                      do {
                        add_to_image(this,gli,(&uStack_603a)[lVar21]);
                        lVar22 = lVar21 + -1;
                        bVar23 = 0 < lVar21;
                        lVar21 = lVar22;
                      } while (lVar22 != 0 && bVar23);
                    }
                    uVar5 = (ulong)((uVar13 & 0xffff) * 2);
                    *(short *)((long)auStack_2038 + uVar5) = (short)local_61ac;
                    *(ushort *)((long)auStack_4038 + uVar5) = (ushort)uVar17 & 0xff;
                    uVar13 = uVar13 + 1;
                    bVar23 = (ushort)iVar19 <= (ushort)uVar13;
                    if (uVar7 < 0xc && bVar23) {
                      local_61b0 = iVar19 * 2 - 1;
                      iVar19 = iVar19 * 2;
                    }
                    local_61b8 = 0;
                    local_61ac = uVar10;
                    uVar8 = uVar7 + (uVar7 < 0xc && bVar23);
                  }
                  goto LAB_0019fc61;
                }
                uVar17 = uVar10 & uVar1;
                add_to_image(this,gli,(unsigned_short)uVar17);
              }
              bVar2 = true;
              local_61ac = uVar10;
            }
LAB_0019fc61:
            uVar15 = uVar14 - uVar7;
          } while (bVar2);
          if (uVar7 <= uVar14) break;
          uVar6 = uVar6 + 1;
          bVar24 = uVar6 < uVar4;
        } while (uVar6 != uVar4 + (uVar4 == 0));
        if (bVar24) {
          return local_61a8;
        }
        uVar4 = std::istream::get();
        uVar4 = uVar4 & 0xffff;
      } while (uVar4 != 0);
      iVar18 = 1;
    }
  }
  return iVar18;
}

Assistant:

int
Am_GIF_Image::process_gif(std::ifstream &ifs, GIF_Load_Info &gli)
{
  // Buffer to hold a block of image data from the GIF file.
  unsigned char buf[256];
  unsigned short data_mask = iminfo.num_colors - 1;

  unsigned short prefix[GIF_TBLSIZE];
  unsigned short suffix[GIF_TBLSIZE];
  unsigned short stack[GIF_TBLSIZE];

  unsigned short istk = 0;

  gli.x = 0;
  gli.y = 0; // initial values

  // Next byte is the initial number of bits used for LZW codes
  unsigned short init_code_size = ifs.get();

  if (init_code_size < 2 || init_code_size > 8) {
    return 0;
  }

  unsigned short clear_code = 1 << init_code_size;
  unsigned short eoi_code = clear_code + 1;
  unsigned short free_code = clear_code + 2;

  // The GIF specification says that, for decompression, the code
  // size should be one bit longer than the initial code size.
  unsigned short code_size = init_code_size + 1;

  // Bit mask needed to extract data bits corresponding to the
  // code size.
  unsigned short max_code = 1 << code_size;
  unsigned short read_mask = max_code - 1;

  ifs.clear();

  unsigned short bitpos = 0;
  unsigned long val = 0;

  for (unsigned short count = ifs.get(); count > 0; count = ifs.get()) {
    // Read a block of data into the buffer
    // ifs.read(buf, count); MSL
    ifs.read((char *)buf, count);
    if (ifs.fail()) {
      return 0;
    }

    // Process the contents of the buffer
    for (unsigned int i = 0; i < count; i++) {
      const unsigned long tmp = buf[i];
      val |= (tmp << bitpos);
      bitpos += 8;

      while (bitpos >= code_size) {
        unsigned short curcode = (unsigned short)(val & read_mask);
        val >>= code_size;
        bitpos -= code_size;
        if (curcode == eoi_code) {
          return 1;
        }
        unsigned short oldcode;
        unsigned short pixel;
        if (curcode == clear_code) {
          free_code = (1 << init_code_size) + 2;
          code_size = init_code_size + 1;
          max_code = 1 << code_size;
          read_mask = max_code - 1;
          istk = 0;
          oldcode = 0xffff;
        } else {
          if (oldcode == 0xffff) {
            // First code, after initialization, is a raw pixel value
            pixel = curcode & data_mask;
            add_to_image(gli, pixel);
            oldcode = curcode;
          } else {
            const unsigned short input_code = curcode;
            if (curcode >= free_code) {
              // Code is not in table yet. Save last character in stack
              stack[istk++] = (unsigned char)pixel;
              curcode = oldcode;
            }
            while (curcode > data_mask) {
              // [eab] I don't know enough about the LZW algorithm
              // to introduce more precise range tests than the following
              // on curcode and istk
              if (curcode >= GIF_TBLSIZE || istk >= GIF_TBLSIZE - 2) {
                return 0; // corrupt GIF
              }
              // Save bytes corresponding to compression code in stack for
              // later use.
              stack[istk++] = suffix[curcode];
              curcode = prefix[curcode];
            }

            pixel = curcode & data_mask;
            stack[istk++] = (unsigned char)pixel;

            // Add decoded string of bytes to image
            for (short j = istk - 1; j >= 0; j--)
              add_to_image(gli, stack[j]);

            istk = 0;

            // Add current information to decompression tables
            prefix[free_code] = oldcode;
            suffix[free_code] = (unsigned char)pixel;
            oldcode = input_code;

            // Adjust code size, if necessary.
            free_code++;
            if (free_code >= max_code) {
              if (code_size < GIF_MAXCODE) {
                code_size++;
                max_code *= 2;
                read_mask = max_code - 1;
              }
            }
          }
        }
      }
    }
  }
  return 1;
}